

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O2

void s_task_next(s_awaiter_t *__awaiter_dummy__)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  uint64_t max_idle_ms;
  s_list_t *psVar5;
  long *in_FS_OFFSET;
  undefined1 auVar6 [16];
  
  lVar1 = *in_FS_OFFSET;
  *(undefined1 *)(in_FS_OFFSET[-8] + 0x50) = 0;
  psVar5 = (s_list_t *)(lVar1 + -0x50);
  while( true ) {
    s_timer_run();
    iVar3 = s_list_is_empty(psVar5);
    if (iVar3 == 0) break;
    _Var2 = rbt_is_empty((RBTree *)(lVar1 + -0x38));
    if (_Var2) {
      uVar4 = s_task_cancel_dead();
      if (uVar4 == 0) {
        fwrite("error: must not wait so long!\n",0x1e,1,_stderr);
        usleep(0xfffffc18);
      }
    }
    else {
      max_idle_ms = s_timer_wait_recent();
      my_on_idle(max_idle_ms);
    }
  }
  iVar3 = s_list_is_empty(psVar5);
  if (iVar3 == 0) {
    lVar1 = in_FS_OFFSET[-8];
    psVar5 = s_list_get_next(psVar5);
    in_FS_OFFSET[-8] = (long)psVar5;
    s_list_detach(psVar5);
    if (lVar1 != in_FS_OFFSET[-8]) {
      auVar6 = jump_fcontext(*(undefined8 *)(in_FS_OFFSET[-8] + 0x40));
      *(long *)*auVar6._8_8_ = auVar6._0_8_;
    }
    return;
  }
  fwrite("error: must has one task to run\n",0x20,1,_stderr);
  return;
}

Assistant:

void s_task_next(__async__) {
    g_globals.current_task->waiting_cancelled = false;
    s_timer_run();
    s_task_call_next(__await__);
}